

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::ReleasePages
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,Recycler *recycler)

{
  char *__s;
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  uint uVar4;
  uint uVar5;
  ConfigFlagsTable *pCVar6;
  IdleDecommitPageAllocator *this_00;
  PageSegment *segmentParam;
  undefined8 *in_FS_OFFSET;
  char *address;
  Recycler *recycler_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&recycler->collectionState);
  if (CVar3 == CollectionStateMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x19d,"(recycler->collectionState != CollectionStateMark)",
                       "recycler->collectionState != CollectionStateMark");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->super_HeapBlock).segment == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x19e,"(segment != nullptr)","segment != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->super_HeapBlock).address == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x19f,"(address != nullptr)","address != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar2 = HeapBlock::IsLeafBlock(&this->super_HeapBlock);
  if ((bVar2) && (pCVar6 = Recycler::GetRecyclerFlagsTable(recycler), (pCVar6->Verbose & 1U) != 0))
  {
    pCVar6 = Recycler::GetRecyclerFlagsTable(recycler);
    bVar2 = Js::Phases::IsEnabled(&pCVar6->Trace,RecyclerPhase);
    if (bVar2) {
      Output::Print(L"Releasing leaf block pages at address 0x%p\n",(this->super_HeapBlock).address)
      ;
    }
  }
  __s = (this->super_HeapBlock).address;
  uVar4 = GetPageCount(this);
  uVar5 = GetUnusablePageCount(this);
  memset(__s,0xfe,(ulong)((uVar4 - uVar5) * 0x1000));
  uVar4 = GetUnusablePageCount(this);
  if (uVar4 != 0) {
    RestoreUnusablePages(this);
  }
  this_00 = GetPageAllocator(this);
  uVar4 = GetPageCount(this);
  segmentParam = GetPageSegment(this);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ReleasePages(&this_00->super_PageAllocator,__s,uVar4,segmentParam);
  (this->super_HeapBlock).segment = (Segment *)0x0;
  (this->super_HeapBlock).address = (char *)0x0;
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::ReleasePages(Recycler * recycler)
{
    Assert(recycler->collectionState != CollectionStateMark);
    Assert(segment != nullptr);
    Assert(address != nullptr);

#if DBG
    if (this->IsLeafBlock())
    {
        RecyclerVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Releasing leaf block pages at address 0x%p\n"), address);
    }
#endif

    char* address = this->address;

#ifdef RECYCLER_FREE_MEM_FILL
    memset(address, DbgMemFill, AutoSystemInfo::PageSize * (this->GetPageCount()-this->GetUnusablePageCount()));
#endif

    if (this->GetUnusablePageCount() > 0)
    {
        this->RestoreUnusablePages();
    }

    this->GetPageAllocator()->ReleasePages(address, this->GetPageCount(), this->GetPageSegment());

    this->segment = nullptr;
    this->address = nullptr;
}